

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O2

void Abc_TgFullEnumeration(Abc_TgMan_t *pWork,Abc_TgMan_t *pBest)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  undefined8 local_100;
  Abc_TgMan_t local_f8;
  
  if (pWork->nAlgorithm < 1) {
    Abc_TgFirstPermutation(pWork);
    do {
      bVar3 = pWork->pGroup[0].nGVars;
      Abc_TgSaveBest(pWork,pBest);
      if (pWork->fPhased == 0) {
        uVar7 = 0;
        if ('\0' < (char)bVar3) {
          uVar7 = (ulong)(uint)(int)(char)bVar3;
        }
        for (uVar5 = 0; uVar5 != uVar7; uVar5 = uVar5 + 1) {
          cVar2 = pWork->pPerm[uVar5];
          for (uVar9 = uVar5; 0 < (long)uVar9; uVar9 = uVar9 - 1) {
            if (pWork->symPhase[local_f8.pPerm[uVar9 - 0x1d]] <= pWork->symPhase[cVar2])
            goto LAB_0042b295;
            local_f8.pPerm[uVar9 - 0x1c] = local_f8.pPerm[uVar9 - 0x1d];
          }
          uVar9 = 0;
LAB_0042b295:
          local_f8.pPerm[(long)(int)uVar9 + -0x1c] = cVar2;
        }
        for (uVar6 = 0; (uVar6 ^ -1 << (bVar3 & 0x1f)) != 0xffffffff; uVar6 = uVar6 + 1) {
          iVar8 = grayFlip(uVar6);
          Abc_TgFlipSymGroupByVar(pWork,(int)local_f8.pPerm[(long)iVar8 + -0x1c]);
          Abc_TgSaveBest(pWork,pBest);
        }
      }
      iVar8 = Abc_TgNextPermutation(pWork);
    } while (iVar8 != 0);
  }
  else {
    iVar8 = 1 << ((char)pBest->nVars - 6U & 0x1f);
    if (pBest->nVars < 7) {
      iVar8 = 1;
    }
    Abc_TtFill(pBest->pTruth,iVar8);
    if (pWork->fPhased == 0) {
      local_100 = pWork->vPhase;
      bVar3 = pWork->pGroup[0].nGVars;
      Abc_TgManCopy(&local_f8,(word *)Abc_TgPhaseEnumerationScc_pCopy,pWork);
      if ((char)bVar3 < '\x01') {
        bVar3 = 0;
      }
      uVar6 = 0;
      for (iVar8 = 0; iVar8 < local_100->nSize; iVar8 = iVar8 + 1) {
        uVar4 = Vec_IntEntry(local_100,iVar8);
        for (uVar7 = 0; bVar3 != uVar7; uVar7 = uVar7 + 1) {
          if (((uVar6 ^ uVar4) >> ((uint)uVar7 & 0x1f) & 1) != 0) {
            Abc_TgFlipSymGroupByVar(&local_f8,(int)pWork->pFGrps[uVar7]);
          }
        }
        Abc_TgPermEnumerationScc(&local_f8,pBest);
        uVar6 = uVar4;
      }
    }
    else {
      Abc_TgPermEnumerationScc(pWork,pBest);
    }
  }
  pbVar1 = (byte *)((long)&pBest->uPhase + 3);
  *pbVar1 = *pbVar1 | 0x40;
  return;
}

Assistant:

static void Abc_TgFullEnumeration(Abc_TgMan_t * pWork, Abc_TgMan_t * pBest)
{
    if (pWork->nAlgorithm > 0)
    {
        Abc_TtFill(pBest->pTruth, Abc_TtWordNum(pBest->nVars));
        Abc_TgPhaseEnumerationScc(pWork, pBest);
    }
    else 
    {
        Abc_TgFirstPermutation(pWork);
        do Abc_TgPhaseEnumeration(pWork, pBest);
        while (Abc_TgNextPermutation(pWork));
    }
    pBest->uPhase |= 1 << 30;
}